

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::TransactionContext::GetSizeIgnoreTxIn(TransactionContext *this,bool use_witness)

{
  int iVar1;
  uint32_t uVar2;
  undefined7 in_register_00000031;
  TxOutReference *txout;
  long lVar3;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  long local_30;
  long local_28;
  
  uVar2 = (int)CONCAT71(in_register_00000031,use_witness) * 2 + 10;
  cfd::core::Transaction::GetTxOutList();
  for (lVar3 = local_30; lVar3 != local_28; lVar3 = lVar3 + 0x50) {
    iVar1 = cfd::core::AbstractTxOutReference::GetSerializeSize();
    uVar2 = uVar2 + iVar1;
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             &local_30);
  return uVar2;
}

Assistant:

uint32_t TransactionContext::GetSizeIgnoreTxIn(bool use_witness) const {
  uint32_t result = AbstractTransaction::kTransactionMinimumSize;
  if (use_witness) result += 2;
  std::vector<TxOutReference> txouts = GetTxOutList();
  for (const auto& txout : txouts) {
    result += txout.GetSerializeSize();
  }
  return result;
}